

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O2

void __thiscall
util_tests::util_FormatISO8601DateTime::test_method(util_FormatISO8601DateTime *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  string *psVar2;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  undefined **local_98;
  undefined1 local_90;
  undefined1 *local_88;
  char *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  char *local_68;
  char *local_60;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_60 = "";
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x148;
  file.m_begin = (iterator)&local_68;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_78,msg);
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01139f30;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = "";
  local_a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_a0 = "";
  FormatISO8601DateTime_abi_cxx11_(&local_58,0xe2493732ff);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[22]>
            (&local_98,&local_a8,0x148,1,2,psVar2,"FormatISO8601DateTime(971890963199)",
             "32767-12-31T23:59:59Z","\"32767-12-31T23:59:59Z\"");
  std::__cxx11::string::~string((string *)&local_58);
  local_b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b0 = "";
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)psVar2;
  msg_00.m_begin = pvVar1;
  file_00.m_end = (iterator)0x149;
  file_00.m_begin = (iterator)&local_b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_c8,msg_00
            );
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01139f30;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = "";
  local_d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_d0 = "";
  FormatISO8601DateTime_abi_cxx11_(&local_58,0xe24935e180);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[22]>
            (&local_98,&local_d8,0x149,1,2,psVar2,"FormatISO8601DateTime(971890876800)",
             "32767-12-31T00:00:00Z","\"32767-12-31T00:00:00Z\"");
  std::__cxx11::string::~string((string *)&local_58);
  local_e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_e0 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)psVar2;
  msg_01.m_begin = pvVar1;
  file_01.m_end = (iterator)0x14a;
  file_01.m_begin = (iterator)&local_e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_f8,msg_01
            );
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01139f30;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = "";
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_100 = "";
  FormatISO8601DateTime_abi_cxx11_(&local_58,0x4e865271);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[21]>
            (&local_98,&local_108,0x14a,1,2,psVar2,"FormatISO8601DateTime(1317425777)",
             "2011-09-30T23:36:17Z","\"2011-09-30T23:36:17Z\"");
  std::__cxx11::string::~string((string *)&local_58);
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = (iterator)psVar2;
  msg_02.m_begin = pvVar1;
  file_02.m_end = (iterator)0x14b;
  file_02.m_begin = (iterator)&local_118;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_128,
             msg_02);
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01139f30;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = "";
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_130 = "";
  FormatISO8601DateTime_abi_cxx11_(&local_58,0);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[21]>
            (&local_98,&local_138,0x14b,1,2,&local_58,"FormatISO8601DateTime(0)",
             "1970-01-01T00:00:00Z","\"1970-01-01T00:00:00Z\"");
  std::__cxx11::string::~string((string *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_FormatISO8601DateTime)
{
    BOOST_CHECK_EQUAL(FormatISO8601DateTime(971890963199), "32767-12-31T23:59:59Z");
    BOOST_CHECK_EQUAL(FormatISO8601DateTime(971890876800), "32767-12-31T00:00:00Z");
    BOOST_CHECK_EQUAL(FormatISO8601DateTime(1317425777), "2011-09-30T23:36:17Z");
    BOOST_CHECK_EQUAL(FormatISO8601DateTime(0), "1970-01-01T00:00:00Z");
}